

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O3

void olsrv2_routing_set_domain_parameter(nhdp_domain *domain,olsrv2_routing_domain *parameter)

{
  olsrv2_routing_domain *poVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined3 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  list_entity *plVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar8 = domain->index;
  auVar10[0] = -(_domain_parameter[iVar8].use_srcip_in_routes == parameter->use_srcip_in_routes);
  auVar10[1] = -(_domain_parameter[iVar8].field_0x1 == parameter->field_0x1);
  auVar10[2] = -(_domain_parameter[iVar8].field_0x2 == parameter->field_0x2);
  auVar10[3] = -(_domain_parameter[iVar8].field_0x3 == parameter->field_0x3);
  auVar10[4] = -((char)_domain_parameter[iVar8].protocol == (char)parameter->protocol);
  auVar10[5] = -(*(char *)((long)&_domain_parameter[iVar8].protocol + 1) ==
                *(char *)((long)&parameter->protocol + 1));
  auVar10[6] = -(*(char *)((long)&_domain_parameter[iVar8].protocol + 2) ==
                *(char *)((long)&parameter->protocol + 2));
  auVar10[7] = -(*(char *)((long)&_domain_parameter[iVar8].protocol + 3) ==
                *(char *)((long)&parameter->protocol + 3));
  auVar10[8] = -((char)_domain_parameter[iVar8].table == (char)parameter->table);
  auVar10[9] = -(*(char *)((long)&_domain_parameter[iVar8].table + 1) ==
                *(char *)((long)&parameter->table + 1));
  auVar10[10] = -(*(char *)((long)&_domain_parameter[iVar8].table + 2) ==
                 *(char *)((long)&parameter->table + 2));
  auVar10[0xb] = -(*(char *)((long)&_domain_parameter[iVar8].table + 3) ==
                  *(char *)((long)&parameter->table + 3));
  auVar10[0xc] = -((char)_domain_parameter[iVar8].distance == (char)parameter->distance);
  auVar10[0xd] = -(*(char *)((long)&_domain_parameter[iVar8].distance + 1) ==
                  *(char *)((long)&parameter->distance + 1));
  auVar10[0xe] = -(*(char *)((long)&_domain_parameter[iVar8].distance + 2) ==
                  *(char *)((long)&parameter->distance + 2));
  auVar10[0xf] = -(*(char *)((long)&_domain_parameter[iVar8].distance + 3) ==
                  *(char *)((long)&parameter->distance + 3));
  uVar2 = *(undefined4 *)&parameter->source_specific;
  uVar3 = *(undefined4 *)&_domain_parameter[iVar8].source_specific;
  auVar11[0] = -((char)uVar3 == (char)uVar2);
  auVar11[1] = -((char)((uint)uVar3 >> 8) == (char)((uint)uVar2 >> 8));
  auVar11[2] = -((char)((uint)uVar3 >> 0x10) == (char)((uint)uVar2 >> 0x10));
  auVar11[3] = -((char)((uint)uVar3 >> 0x18) == (char)((uint)uVar2 >> 0x18));
  auVar11[4] = 0xff;
  auVar11[5] = 0xff;
  auVar11[6] = 0xff;
  auVar11[7] = 0xff;
  auVar11[8] = 0xff;
  auVar11[9] = 0xff;
  auVar11[10] = 0xff;
  auVar11[0xb] = 0xff;
  auVar11[0xc] = 0xff;
  auVar11[0xd] = 0xff;
  auVar11[0xe] = 0xff;
  auVar11[0xf] = 0xff;
  auVar11 = auVar11 & auVar10;
  if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) {
    poVar1 = _domain_parameter + iVar8;
    uVar4 = *(undefined3 *)&parameter->field_0x11;
    _domain_parameter[iVar8].source_specific = parameter->source_specific;
    *(undefined3 *)&_domain_parameter[iVar8].field_0x11 = uVar4;
    uVar4 = *(undefined3 *)&parameter->field_0x1;
    iVar5 = parameter->protocol;
    iVar6 = parameter->table;
    iVar7 = parameter->distance;
    poVar1->use_srcip_in_routes = parameter->use_srcip_in_routes;
    *(undefined3 *)&poVar1->field_0x1 = uVar4;
    poVar1->protocol = iVar5;
    _domain_parameter[iVar8].table = iVar6;
    _domain_parameter[iVar8].distance = iVar7;
    iVar8 = domain->index;
    if (_routing_tree[iVar8].count != 0) {
      plVar9 = _routing_tree[iVar8].list_head.next;
      if (plVar9->prev != _routing_tree[iVar8].list_head.prev) {
        do {
          if (*(char *)((long)&plVar9[-8].prev + 3) == '\x01') {
            *(undefined1 *)((long)&plVar9[-8].prev + 3) = 0;
            if (*(char *)((long)&plVar9[-8].prev + 4) == '\x01') {
              os_routing_linux_interrupt((os_route *)&plVar9[-0x17].prev);
              *(undefined1 *)((long)&plVar9[-8].prev + 3) = 0;
            }
            _add_route_to_kernel_queue((olsrv2_routing_entry *)&plVar9[-0x17].prev);
            iVar8 = domain->index;
          }
          plVar9 = plVar9->next;
        } while (plVar9->prev != _routing_tree[iVar8].list_head.prev);
      }
      _process_kernel_queue();
      oonf_timer_set_ext(&_rate_limit_timer,100,100);
      _trigger_dijkstra = 1;
    }
  }
  return;
}

Assistant:

void
olsrv2_routing_set_domain_parameter(struct nhdp_domain *domain, struct olsrv2_routing_domain *parameter) {
  struct olsrv2_routing_entry *rtentry;

  if (memcmp(parameter, &_domain_parameter[domain->index], sizeof(*parameter)) == 0) {
    /* no change */
    return;
  }

  /* copy parameters */
  memcpy(&_domain_parameter[domain->index], parameter, sizeof(*parameter));

  if (avl_is_empty(&_routing_tree[domain->index])) {
    /* no routes present */
    return;
  }

  /* remove old kernel routes */
  avl_for_each_element(&_routing_tree[domain->index], rtentry, _node) {
    if (rtentry->set) {
      rtentry->set = false;

      if (rtentry->in_processing) {
        os_routing_interrupt(&rtentry->route);
        rtentry->set = false;
      }

      _add_route_to_kernel_queue(rtentry);
    }
  }

  _process_kernel_queue();

  /* trigger a dijkstra to write new routes in 100 milliseconds */
  oonf_timer_set(&_rate_limit_timer, 100);
  _trigger_dijkstra = true;
}